

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O2

bcf_sr_regions_t * bcf_sr_regions_init(char *regions,int is_file,int ichr,int ifrom,int ito)

{
  ulong uVar1;
  int iVar2;
  bcf_sr_regions_t *pbVar3;
  htsFile *fp;
  tbx_t *tbx;
  char **ppcVar4;
  void *pvVar5;
  char *pcVar6;
  size_t sVar7;
  undefined4 in_register_00000084;
  ulong uVar8;
  long lVar9;
  int from;
  undefined4 local_58;
  int to;
  ulong local_50;
  char *chr_end;
  char *chr;
  char *local_38;
  
  local_50 = CONCAT44(in_register_00000084,ito);
  if (is_file == 0) {
    pbVar3 = _regions_init_string(regions);
    return pbVar3;
  }
  pbVar3 = (bcf_sr_regions_t *)calloc(1,0xb0);
  pbVar3->start = -1;
  pbVar3->end = -1;
  pbVar3->prev_seq = -1;
  pbVar3->prev_start = -1;
  fp = hts_open(regions,"rb");
  pbVar3->file = fp;
  if (fp == (htsFile *)0x0) {
    fprintf(_stderr,"[%s:%d %s] Could not open file: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
            ,0x3dd,"bcf_sr_regions_init",regions);
  }
  else {
    tbx = tbx_index_load(regions);
    pbVar3->tbx = tbx;
    if (tbx != (tbx_t *)0x0) {
      ppcVar4 = tbx_seqnames(tbx,&pbVar3->nseqs);
      pbVar3->seq_names = ppcVar4;
      if (pbVar3->seq_hash == (void *)0x0) {
        pvVar5 = khash_str2int_init();
        pbVar3->seq_hash = pvVar5;
      }
      for (lVar9 = 0; lVar9 < pbVar3->nseqs; lVar9 = lVar9 + 1) {
        khash_str2int_set(pbVar3->seq_hash,pbVar3->seq_names[lVar9],(int)lVar9);
      }
      pcVar6 = strdup(regions);
      pbVar3->fname = pcVar6;
      pbVar3->is_bin = 1;
      return pbVar3;
    }
    sVar7 = strlen(regions);
    iVar2 = strcasecmp(".bed",regions + (long)(int)sVar7 + -4);
    local_38 = regions;
    if (iVar2 == 0) {
      local_58 = 0;
    }
    else {
      iVar2 = strcasecmp(".bed.gz",regions + (long)(int)sVar7 + -7);
      local_58 = CONCAT31((int3)((uint)iVar2 >> 8),iVar2 != 0);
    }
    uVar1 = local_50;
    if ((fp->format).format == vcf) {
      uVar1 = 1;
    }
    local_50 = uVar1 & 0xffffffff;
    uVar8 = (ulong)(uint)-(int)uVar1;
    if (0 < (int)uVar1) {
      uVar8 = uVar1 & 0xffffffff;
    }
    while (iVar2 = hts_getline(fp,2,&pbVar3->line), 0 < iVar2) {
      iVar2 = _regions_parse_line((pbVar3->line).s,ichr,ifrom,(int)uVar8,&chr,&chr_end,&from,&to);
      if ((iVar2 < 0) &&
         ((-1 < (int)local_50 ||
          (iVar2 = _regions_parse_line((pbVar3->line).s,ichr,ifrom,ifrom,&chr,&chr_end,&from,&to),
          iVar2 < 0)))) {
        fprintf(_stderr,"[%s:%d] Could not parse the file %s, using the columns %d,%d[,%d]\n",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
                ,0x3f7,local_38,(ulong)(ichr + 1),(ulong)(ifrom + 1),(ulong)((int)local_50 + 1));
        hts_close(pbVar3->file);
        goto LAB_001111c7;
      }
      pcVar6 = chr_end;
      if (iVar2 != 0) {
        if ((char)local_58 == '\0') {
          from = from + 1;
        }
        *chr_end = '\0';
        _regions_add(pbVar3,chr,from,to);
        *pcVar6 = '\t';
      }
      fp = pbVar3->file;
    }
    hts_close(pbVar3->file);
    pbVar3->file = (htsFile *)0x0;
    if (pbVar3->nseqs != 0) {
      return pbVar3;
    }
  }
LAB_001111c7:
  free(pbVar3);
  return (bcf_sr_regions_t *)0x0;
}

Assistant:

bcf_sr_regions_t *bcf_sr_regions_init(const char *regions, int is_file, int ichr, int ifrom, int ito)
{
    bcf_sr_regions_t *reg;
    if ( !is_file ) return _regions_init_string(regions);

    reg = (bcf_sr_regions_t *) calloc(1, sizeof(bcf_sr_regions_t));
    reg->start = reg->end = -1;
    reg->prev_start = reg->prev_seq = -1;

    reg->file = hts_open(regions, "rb");
    if ( !reg->file )
    {
        fprintf(stderr,"[%s:%d %s] Could not open file: %s\n", __FILE__,__LINE__,__FUNCTION__,regions);
        free(reg);
        return NULL;
    }

    reg->tbx = tbx_index_load(regions);
    if ( !reg->tbx )
    {
        int len = strlen(regions);
        int is_bed  = strcasecmp(".bed",regions+len-4) ? 0 : 1;
        if ( !is_bed && !strcasecmp(".bed.gz",regions+len-7) ) is_bed = 1;

        if ( reg->file->format.format==vcf ) ito = 1;

        // read the whole file, tabix index is not present
        while ( hts_getline(reg->file, KS_SEP_LINE, &reg->line) > 0 )
        {
            char *chr, *chr_end;
            int from, to, ret;
            ret = _regions_parse_line(reg->line.s, ichr,ifrom,abs(ito), &chr,&chr_end,&from,&to);
            if ( ret < 0 )
            {
                if ( ito<0 )
                    ret = _regions_parse_line(reg->line.s, ichr,ifrom,ifrom, &chr,&chr_end,&from,&to);
                if ( ret<0 )
                {
                    fprintf(stderr,"[%s:%d] Could not parse the file %s, using the columns %d,%d[,%d]\n", __FILE__,__LINE__,regions,ichr+1,ifrom+1,ito+1);
                    hts_close(reg->file); reg->file = NULL; free(reg);
                    return NULL;
                }
            }
            if ( !ret ) continue;
            if ( is_bed ) from++;
            *chr_end = 0;
            _regions_add(reg, chr, from, to);
            *chr_end = '\t';
        }
        hts_close(reg->file); reg->file = NULL;
        if ( !reg->nseqs ) { free(reg); return NULL; }
        return reg;
    }

    reg->seq_names = (char**) tbx_seqnames(reg->tbx, &reg->nseqs);
    if ( !reg->seq_hash )
        reg->seq_hash = khash_str2int_init();
    int i;
    for (i=0; i<reg->nseqs; i++)
    {
        khash_str2int_set(reg->seq_hash,reg->seq_names[i],i);
    }
    reg->fname  = strdup(regions);
    reg->is_bin = 1;
    return reg;
}